

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

void Bmc_GiaGenerateJust(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvValues,Vec_Bit_t **pvJustis)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Vec_Bit_t *vValues;
  int *__s;
  Vec_Bit_t *vJustis;
  int *__s_00;
  long lVar7;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong *puVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  
  uVar6 = (pCex->iFrame + 1) * p->nObjs;
  iVar21 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
  vValues = (Vec_Bit_t *)malloc(0x10);
  uVar6 = iVar21 * 0x20;
  vValues->nCap = uVar6;
  if (iVar21 == 0) {
    sVar11 = 0;
    __s = (int *)0x0;
  }
  else {
    sVar11 = (long)iVar21 * 4;
    __s = (int *)malloc(sVar11);
  }
  vValues->pArray = __s;
  vValues->nSize = uVar6;
  memset(__s,0,sVar11);
  vJustis = (Vec_Bit_t *)malloc(0x10);
  vJustis->nCap = uVar6;
  if (iVar21 == 0) {
    sVar11 = 0;
    __s_00 = (int *)0x0;
  }
  else {
    sVar11 = (long)iVar21 << 2;
    __s_00 = (int *)malloc(sVar11);
  }
  vJustis->pArray = __s_00;
  vJustis->nSize = uVar6;
  memset(__s_00,0,sVar11);
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  iVar21 = p->nRegs;
  uVar17 = 0;
  if (0 < iVar21) {
    uVar22 = 0;
    do {
      iVar13 = p->vCos->nSize;
      uVar17 = (iVar13 - iVar21) + uVar22;
      if (((int)uVar17 < 0) || (iVar13 <= (int)uVar17)) goto LAB_0057d16b;
      iVar21 = p->vCos->pArray[uVar17];
      lVar14 = (long)iVar21;
      if ((lVar14 < 0) || (p->nObjs <= iVar21)) goto LAB_0057d14c;
      pGVar2 = p->pObjs;
      uVar17 = uVar22;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar17 = uVar22 + 1;
      *(ulong *)(pGVar2 + lVar14) =
           *(ulong *)(pGVar2 + lVar14) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar22 >> 5] >> ((byte)uVar22 & 0x1f) & 1) << 0x1e);
      iVar21 = p->nRegs;
      uVar22 = uVar17;
    } while ((int)uVar17 < iVar21);
  }
  iVar21 = pCex->iFrame;
  if (-1 < iVar21) {
    uVar16 = (ulong)(uint)p->nObjs;
    iVar13 = 0;
    iVar5 = 0;
    do {
      if (0 < (int)uVar16) {
        lVar14 = 0;
        lVar7 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar23 = *(ulong *)(&pGVar2->field_0x0 + lVar14);
          uVar19 = (uint)uVar23;
          iVar21 = (int)(uVar23 & 0x1fffffff);
          uVar22 = (uint)(uVar23 >> 0x20);
          if ((uVar23 & 0x1fffffff) == 0x1fffffff || (int)uVar19 < 0) {
            if ((~uVar19 & 0x9fffffff) == 0) {
              uVar22 = uVar22 & 0x1fffffff;
              iVar21 = p->vCis->nSize;
              if ((int)uVar22 < iVar21 - p->nRegs) {
                uVar23 = uVar23 & 0xbfffffffbfffffff | 0x4000000000000000 |
                         (ulong)(((uint)(&pCex[1].iPo)[(int)uVar17 >> 5] >> ((byte)uVar17 & 0x1f) &
                                 1) << 0x1e);
                uVar17 = uVar17 + 1;
              }
              else {
                iVar1 = p->vCos->nSize;
                uVar19 = (iVar1 - iVar21) + uVar22;
                if (((int)uVar19 < 0) || (iVar1 <= (int)uVar19)) goto LAB_0057d16b;
                uVar19 = p->vCos->pArray[uVar19];
                if (((long)(int)uVar19 < 0) || ((uint)uVar16 <= uVar19)) goto LAB_0057d14c;
                uVar23 = uVar23 & 0xffffffffbfffffff |
                         (ulong)((uint)*(undefined8 *)(pGVar2 + (int)uVar19) & 0x40000000);
                *(ulong *)(&pGVar2->field_0x0 + lVar14) = uVar23;
                iVar21 = p->vCis->nSize;
                if ((int)uVar22 < iVar21 - p->nRegs) {
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                iVar1 = p->vCos->nSize;
                uVar22 = (iVar1 - iVar21) + uVar22;
                if (((int)uVar22 < 0) || (iVar1 <= (int)uVar22)) goto LAB_0057d16b;
                iVar21 = p->vCos->pArray[uVar22];
                if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) goto LAB_0057d14c;
                uVar16 = *(ulong *)(p->pObjs + iVar21);
LAB_0057ce7c:
                uVar23 = uVar23 & 0xbfffffffffffffff | uVar16 & 0x4000000000000000;
              }
            }
            else {
              if ((int)uVar19 < 0 && iVar21 != 0x1fffffff) {
                puVar15 = (ulong *)((long)pGVar2 + (ulong)(uint)(iVar21 << 2) * -3 + lVar14);
                uVar23 = uVar23 & 0xffffffffbfffffff |
                         (ulong)((uVar19 * 2 ^ (uint)*puVar15) & 0x40000000);
                *(ulong *)(&pGVar2->field_0x0 + lVar14) = uVar23;
                uVar16 = *puVar15;
                goto LAB_0057ce7c;
              }
              if ((~uVar23 & 0x1fffffff1fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                              ,0x9e,
                              "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                             );
              }
              uVar23 = uVar23 | 0x4000000000000000;
            }
          }
          else {
            uVar16 = *(ulong *)((long)pGVar2 + (ulong)(uint)(iVar21 << 2) * -3 + lVar14);
            uVar10 = (uint)(uVar23 >> 0x1d) & 7 ^ (uint)(uVar16 >> 0x1e) & 3;
            uVar3 = *(ulong *)((long)pGVar2 +
                              (ulong)((uint)(uVar23 >> 0x1e) & 0x7ffffffc) * -3 + lVar14);
            uVar20 = (uint)(uVar3 >> 0x1e) & 1;
            uVar8 = uVar22 >> 0x1d & 1;
            uVar12 = (uVar20 ^ uVar8) & uVar10;
            uVar18 = (ulong)(uVar12 << 0x1e);
            *(ulong *)(&pGVar2->field_0x0 + lVar14) = uVar23 & 0xffffffff3fffffff | uVar18;
            uVar22 = (uint)(uVar16 >> 0x20);
            uVar19 = (uint)(uVar3 >> 0x20);
            if (uVar12 == 0) {
              if (((uVar10 & 1) == 0) && (uVar20 == uVar8)) {
                uVar23 = uVar23 & 0xbfffffff3fffffff |
                         ((ulong)((uVar19 | uVar22) >> 0x1e) & 1) << 0x3e;
              }
              else if ((uVar10 & 1) == 0) {
                uVar23 = uVar23 & 0xbfffffff3fffffff | uVar16 & 0x4000000000000000;
              }
              else {
                if (uVar20 != uVar8) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                                ,0x88,
                                "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                               );
                }
                uVar23 = uVar23 & 0xbfffffff3fffffff | uVar3 & 0x4000000000000000;
              }
            }
            else {
              uVar23 = uVar23 & 0xbfffffff3fffffff | uVar18 |
                       (ulong)((uVar19 & uVar22) >> 0x1e & 1) << 0x3e;
            }
          }
          *(ulong *)(&pGVar2->field_0x0 + lVar14) = uVar23;
          if (((uint)uVar23 >> 0x1e & 1) != 0) {
            uVar16 = iVar13 + lVar7;
            if (((long)uVar16 < 0) || ((long)(int)uVar6 <= (long)uVar16)) goto LAB_0057d12d;
            __s[uVar16 >> 5] = __s[uVar16 >> 5] | 1 << ((char)iVar13 + (char)lVar7 & 0x1fU);
            uVar23 = *(ulong *)(&pGVar2->field_0x0 + lVar14);
          }
          if ((uVar23 & 0x4000000000000000) != 0) {
            uVar16 = iVar13 + lVar7;
            if (((long)uVar16 < 0) || ((long)(int)uVar6 <= (long)uVar16)) {
LAB_0057d12d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
            }
            __s_00[uVar16 >> 5] = __s_00[uVar16 >> 5] | 1 << ((char)iVar13 + (char)lVar7 & 0x1fU);
          }
          lVar7 = lVar7 + 1;
          uVar16 = (ulong)p->nObjs;
          lVar14 = lVar14 + 0xc;
        } while (lVar7 < (long)uVar16);
        iVar21 = pCex->iFrame;
      }
      iVar13 = iVar13 + (int)uVar16;
      bVar4 = iVar5 < iVar21;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  if (uVar17 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0xa5,
                  "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)");
  }
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  uVar17 = pCex->iPo;
  iVar21 = p->vCos->nSize;
  if (iVar21 - p->nRegs <= (int)uVar17) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar17) && ((int)uVar17 < iVar21)) {
    iVar21 = p->vCos->pArray[uVar17];
    if ((-1 < (long)iVar21) && (iVar21 < p->nObjs)) {
      iVar13 = pCex->iFrame;
      uVar17 = p->nObjs * iVar13 + iVar21;
      if ((-1 < (int)uVar17) && ((int)uVar17 < (int)uVar6)) {
        if (((uint)__s_00[uVar17 >> 5] >> (uVar17 & 0x1f) & 1) != 0) {
          __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0xaa,
                        "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                       );
        }
        pGVar9 = p->pObjs + iVar21;
        __s_00[uVar17 >> 5] = __s_00[uVar17 >> 5] | 1 << ((byte)uVar17 & 0x1f);
        Bmc_GiaGenerateJustNonRec(p,iVar13,vValues,vJustis);
        pGVar2 = p->pObjs;
        if ((pGVar9 < pGVar2) || (pGVar2 + p->nObjs <= pGVar9)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar17 = (int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2) * -0x55555555 +
                 p->nObjs * pCex->iFrame;
        if ((-1 < (int)uVar17) && (uVar17 < uVar6)) {
          if (((uint)__s_00[uVar17 >> 5] >> (uVar17 & 0x1f) & 1) == 0) {
            __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                          ,0xae,
                          "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                         );
          }
          *pvValues = vValues;
          *pvJustis = vJustis;
          return;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
LAB_0057d14c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0057d16b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Bmc_GiaGenerateJust( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvValues, Vec_Bit_t ** pvJustis )
{
    Vec_Bit_t * vValues = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Vec_Bit_t * vJustis = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Gia_Obj_t * pObj;
    int i, k, iBit = 0, fCompl0, fCompl1, fJusti0, fJusti1, Shift;

    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    Gia_ManForEachRi( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    for ( Shift = i = 0; i <= pCex->iFrame; i++, Shift += Gia_ManObjNum(p) )
    {
        Gia_ManForEachObj( p, pObj, k )
        {
            if ( Gia_ObjIsAnd(pObj) )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                fJusti0 = Gia_ObjFanin0(pObj)->fMark1;
                fJusti1 = Gia_ObjFanin1(pObj)->fMark1;
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->fMark1 = fJusti0 & fJusti1;
                else if ( !fCompl0 && !fCompl1 )
                    pObj->fMark1 = fJusti0 | fJusti1;
                else if ( !fCompl0 )
                    pObj->fMark1 = fJusti0;
                else if ( !fCompl1 )
                    pObj->fMark1 = fJusti1;
                else assert( 0 );
            }
            else if ( Gia_ObjIsCi(pObj) )
            {
                if ( Gia_ObjIsPi(p, pObj) )
                {
                    pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
                    pObj->fMark1 = 1;
                }
                else
                {
                    pObj->fMark0 = Gia_ObjRoToRi(p, pObj)->fMark0;
                    pObj->fMark1 = Gia_ObjRoToRi(p, pObj)->fMark1;
                }
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            }
            else if ( Gia_ObjIsConst0(pObj) )
                pObj->fMark1 = 1;
            else assert( 0 );
            if ( pObj->fMark0 )
                Vec_BitWriteEntry( vValues, Shift + k, 1 );
            if ( pObj->fMark1 )
                Vec_BitWriteEntry( vJustis, Shift + k, 1 );
        }
    }
    assert( iBit == pCex->nBits );
    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    // perform backward traversal to mark just nodes
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0 );
//    Bmc_GiaGenerateJust_rec( p, pCex->iFrame, Gia_ObjId(p, pObj), vValues, vJustis );
    Vec_BitWriteEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj), 1);
    Bmc_GiaGenerateJustNonRec( p, pCex->iFrame, vValues, vJustis );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1 );

    // return the result
    *pvValues = vValues;
    *pvJustis = vJustis;
}